

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::to_string<std::optional<long>,std::optional<char>>
          (string *__return_storage_ptr__,lest *this,optional<long> *lhs,string *op,
          optional<char> *rhs)

{
  ostream *poVar1;
  optional<long> *value;
  optional<char> *value_00;
  string local_1f0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  optional<char> *rhs_local;
  string *op_local;
  optional<long> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string<std::optional<long>>(&local_1c0,this,value);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string<std::optional<char>>(&local_1f0,(lest *)op,value_00);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}